

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

void secp256k1_musig_nonce_process_internal
               (int *fin_nonce_parity,uchar *fin_nonce,secp256k1_scalar *b,
               secp256k1_ge *aggnonce_pts,uchar *agg_pk32,uchar *msg)

{
  int iVar1;
  uchar *in_RSI;
  int *in_RDI;
  secp256k1_gej fin_nonce_ptj;
  secp256k1_ge fin_nonce_pt;
  uchar noncehash [32];
  int *in_stack_fffffffffffffed0;
  uchar *in_stack_fffffffffffffed8;
  secp256k1_scalar *in_stack_fffffffffffffee0;
  secp256k1_gej *in_stack_ffffffffffffff18;
  secp256k1_ge *in_stack_ffffffffffffff20;
  secp256k1_scalar *in_stack_ffffffffffffff40;
  secp256k1_ge *in_stack_ffffffffffffff48;
  secp256k1_gej *in_stack_ffffffffffffff50;
  uchar *in_stack_ffffffffffffff58;
  uchar *in_stack_ffffffffffffff60;
  secp256k1_ge *in_stack_ffffffffffffff68;
  uchar *in_stack_ffffffffffffff70;
  secp256k1_fe asStack_88 [3];
  uchar *local_10;
  int *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  secp256k1_musig_compute_noncehash
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  secp256k1_scalar_set_b32
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  secp256k1_effective_nonce
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  secp256k1_ge_set_gej(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x10c4be);
  if (iVar1 != 0) {
    memcpy(&stack0xffffffffffffff50,&secp256k1_ge_const_g,0x58);
  }
  secp256k1_fe_impl_normalize_var((secp256k1_fe *)&stack0xffffffffffffff50);
  secp256k1_fe_impl_get_b32(local_10,(secp256k1_fe *)&stack0xffffffffffffff50);
  secp256k1_fe_impl_normalize_var(asStack_88);
  iVar1 = secp256k1_fe_impl_is_odd(asStack_88);
  *local_8 = iVar1;
  return;
}

Assistant:

static void secp256k1_musig_nonce_process_internal(int *fin_nonce_parity, unsigned char *fin_nonce, secp256k1_scalar *b, secp256k1_ge *aggnonce_pts, const unsigned char *agg_pk32, const unsigned char *msg) {
    unsigned char noncehash[32];
    secp256k1_ge fin_nonce_pt;
    secp256k1_gej fin_nonce_ptj;

    secp256k1_musig_compute_noncehash(noncehash, aggnonce_pts, agg_pk32, msg);
    secp256k1_scalar_set_b32(b, noncehash, NULL);
    /* fin_nonce = aggnonce_pts[0] + b*aggnonce_pts[1] */
    secp256k1_effective_nonce(&fin_nonce_ptj, aggnonce_pts, b);
    secp256k1_ge_set_gej(&fin_nonce_pt, &fin_nonce_ptj);
    if (secp256k1_ge_is_infinity(&fin_nonce_pt)) {
        fin_nonce_pt = secp256k1_ge_const_g;
    }
    /* fin_nonce_pt is not the point at infinity */
    secp256k1_fe_normalize_var(&fin_nonce_pt.x);
    secp256k1_fe_get_b32(fin_nonce, &fin_nonce_pt.x);
    secp256k1_fe_normalize_var(&fin_nonce_pt.y);
    *fin_nonce_parity = secp256k1_fe_is_odd(&fin_nonce_pt.y);
}